

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void constructAutomaticIndex
               (Parse *pParse,WhereClause *pWC,SrcItem *pSrc,Bitmask notReady,WhereLevel *pLevel)

{
  byte *pbVar1;
  undefined1 *puVar2;
  byte bVar3;
  u8 uVar4;
  short sVar5;
  ushort uVar6;
  Vdbe *p;
  Table *pTVar7;
  WhereLoop *p_00;
  SrcList *pSVar8;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int p3;
  int iVar15;
  Expr *pEVar16;
  Index *pIdx;
  CollSeq *pCVar17;
  uint uVar18;
  WhereTerm *pWVar19;
  char *pcVar20;
  Op *pOVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  WhereTerm *pWVar27;
  ulong uVar28;
  uint uVar29;
  Expr *local_a0;
  long local_70;
  char *zNotUsed;
  
  p = pParse->pVdbe;
  iVar25 = 0;
  iVar12 = sqlite3VdbeAddOp3(p,0xf,0,0,0);
  pTVar7 = pSrc->pTab;
  pWVar27 = pWC->a;
  pWVar19 = pWVar27 + pWC->nTerm;
  p_00 = pLevel->pWLoop;
  if ((long)pWC->nTerm < 1) {
    uVar22 = 0xffffffffffffffff;
    local_a0 = (Expr *)0x0;
  }
  else {
    iVar25 = 0;
    uVar22 = 0;
    bVar9 = false;
    local_a0 = (Expr *)0x0;
    do {
      if ((pWVar27->wtFlags & 2) == 0) {
        pEVar16 = pWVar27->pExpr;
        iVar13 = sqlite3ExprIsTableConstraint(pEVar16,pSrc);
        if (iVar13 != 0) {
          if (pEVar16 == (Expr *)0x0) {
            pEVar16 = (Expr *)0x0;
          }
          else {
            pEVar16 = exprDup(pParse->db,pEVar16,0,(u8 **)0x0);
          }
          local_a0 = sqlite3ExprAnd(pParse,local_a0,pEVar16);
        }
      }
      iVar13 = termCanDriveIndex(pWVar27,pSrc,notReady);
      if (iVar13 == 0) {
        bVar10 = true;
      }
      else {
        iVar13 = (pWVar27->u).x.leftColumn;
        uVar23 = 1L << ((byte)iVar13 & 0x3f);
        if (0x3f < iVar13) {
          uVar23 = 0x8000000000000000;
        }
        if (!bVar9) {
          sqlite3_log(0x11c,"automatic index on %s(%s)",pTVar7->zName);
        }
        if ((uVar23 & uVar22) == 0) {
          iVar13 = iVar25 + 1;
          iVar14 = whereLoopResize(pParse->db,p_00,iVar13);
          if (iVar14 == 0) {
            p_00->aLTerm[iVar25] = pWVar27;
            uVar22 = uVar22 | uVar23;
            bVar10 = true;
          }
          else {
            bVar10 = false;
            iVar13 = iVar25;
          }
        }
        else {
          bVar10 = true;
          iVar13 = iVar25;
        }
        bVar9 = true;
        iVar25 = iVar13;
      }
      if (!bVar10) goto LAB_0019e2d0;
      pWVar27 = pWVar27 + 1;
    } while (pWVar27 < pWVar19);
    uVar22 = ~uVar22 | 0x8000000000000000;
  }
  p_00->nLTerm = (u16)iVar25;
  (p_00->u).btree.nEq = (u16)iVar25;
  p_00->wsFlags = 0x4241;
  uVar22 = uVar22 & pSrc->colUsed;
  sVar5 = pTVar7->nCol;
  uVar29 = (uint)sVar5;
  uVar18 = 0x3f;
  if (sVar5 < 0x3f) {
    uVar18 = uVar29;
  }
  if (0 < (int)uVar29) {
    uVar23 = 0;
    do {
      iVar25 = iVar25 + (uint)((uVar22 >> (uVar23 & 0x3f) & 1) != 0);
      uVar23 = uVar23 + 1;
    } while (uVar18 != uVar23);
  }
  iVar13 = 1;
  if ((long)pSrc->colUsed < 0) {
    iVar13 = uVar29 - 0x3e;
  }
  uVar23 = 0;
  pIdx = sqlite3AllocateIndexObject(pParse->db,(i16)(iVar13 + iVar25),0,&zNotUsed);
  if (pIdx != (Index *)0x0) {
    (p_00->u).btree.pIndex = pIdx;
    pIdx->zName = "auto-index";
    pIdx->pTable = pTVar7;
    pWVar27 = pWC->a;
    if (pWVar27 < pWVar19) {
      uVar23 = 0;
      uVar24 = 0;
      do {
        iVar14 = termCanDriveIndex(pWVar27,pSrc,notReady);
        if (iVar14 != 0) {
          iVar14 = (pWVar27->u).x.leftColumn;
          uVar28 = 1L << ((byte)iVar14 & 0x3f);
          if (0x3f < iVar14) {
            uVar28 = 0x8000000000000000;
          }
          if ((uVar28 & uVar24) == 0) {
            pEVar16 = pWVar27->pExpr;
            iVar26 = (int)uVar23;
            pIdx->aiColumn[iVar26] = (i16)iVar14;
            pCVar17 = sqlite3ExprCompareCollSeq(pParse,pEVar16);
            pcVar20 = "BINARY";
            if (pCVar17 != (CollSeq *)0x0) {
              pcVar20 = pCVar17->zName;
            }
            uVar24 = uVar24 | uVar28;
            pIdx->azColl[iVar26] = pcVar20;
            uVar23 = (ulong)(iVar26 + 1);
          }
        }
        pWVar27 = pWVar27 + 1;
      } while (pWVar27 < pWVar19);
    }
    if (0 < sVar5) {
      uVar24 = 0;
      do {
        if ((uVar22 >> (uVar24 & 0x3f) & 1) != 0) {
          iVar14 = (int)uVar23;
          pIdx->aiColumn[iVar14] = (i16)uVar24;
          pIdx->azColl[iVar14] = "BINARY";
          uVar23 = (ulong)(iVar14 + 1);
        }
        uVar24 = uVar24 + 1;
      } while (uVar18 != uVar24);
    }
    if (((long)pSrc->colUsed < 0) && (0x3f < pTVar7->nCol)) {
      uVar23 = (ulong)(int)uVar23;
      iVar14 = 0x3f;
      do {
        pIdx->aiColumn[uVar23] = (i16)iVar14;
        pIdx->azColl[uVar23] = "BINARY";
        uVar23 = uVar23 + 1;
        iVar14 = iVar14 + 1;
      } while (iVar14 < pTVar7->nCol);
    }
    iVar26 = (int)uVar23;
    pIdx->aiColumn[iVar26] = -1;
    pIdx->azColl[iVar26] = "BINARY";
    iVar14 = pParse->nTab;
    pParse->nTab = iVar14 + 1;
    pLevel->iIdxCur = iVar14;
    sqlite3VdbeAddOp3(p,0x74,iVar14,iVar13 + iVar25,0);
    sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
    if ((pParse->db->dbOptFlags & 0x80000) == 0) {
      iVar25 = pParse->nMem + 1;
      pParse->nMem = iVar25;
      pLevel->regFilter = iVar25;
      sqlite3VdbeAddOp3(p,0x4d,10000,iVar25,0);
    }
    pSVar8 = pWC->pWInfo->pTabList;
    bVar3 = pLevel->iFrom;
    if ((pSVar8->a[bVar3].fg.field_0x1 & 0x20) == 0) {
      local_70 = 0;
      iVar25 = sqlite3VdbeAddOp3(p,0x24,pLevel->iTabCur,0,0);
    }
    else {
      iVar25 = pSVar8->a[bVar3].regReturn;
      iVar13 = sqlite3VdbeAddOp3(p,0x47,0,0,0);
      sqlite3VdbeAddOp3(p,0xb,iVar25,0,pSVar8->a[bVar3].addrFillSub);
      iVar25 = sqlite3VdbeAddOp3(p,0xc,iVar25,0,0);
      local_70 = (long)iVar13;
    }
    if (local_a0 == (Expr *)0x0) {
      iVar13 = 0;
    }
    else {
      iVar13 = pParse->nLabel + -1;
      pParse->nLabel = iVar13;
      sqlite3ExprIfFalse(pParse,local_a0,iVar13,0x10);
      pbVar1 = (byte *)((long)&p_00->wsFlags + 2);
      *pbVar1 = *pbVar1 | 2;
    }
    if (pParse->nTempReg == '\0') {
      iVar14 = pParse->nMem + 1;
      pParse->nMem = iVar14;
    }
    else {
      bVar11 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar11;
      iVar14 = pParse->aTempReg[bVar11];
    }
    p3 = sqlite3GenerateIndexKey(pParse,pIdx,pLevel->iTabCur,iVar14,0,(int *)0x0,(Index *)0x0,0);
    if (pLevel->regFilter != 0) {
      uVar6 = (p_00->u).btree.nEq;
      iVar15 = sqlite3VdbeAddOp3(p,0xb4,pLevel->regFilter,0,p3);
      if (p->db->mallocFailed == '\0') {
        pOVar21 = p->aOp;
        pOVar21[iVar15].p4type = -3;
        *(uint *)&pOVar21[iVar15].p4 = (uint)uVar6;
      }
    }
    sqlite3VdbeAddOp3(p,0x8a,pLevel->iIdxCur,iVar14,0);
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = 0x10;
    }
    if (local_a0 != (Expr *)0x0) {
      sqlite3VdbeResolveLabel(p,iVar13);
    }
    if ((pSVar8->a[bVar3].fg.field_0x1 & 0x20) == 0) {
      sqlite3VdbeAddOp3(p,0x27,pLevel->iTabCur,iVar25 + 1,0);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = 3;
      }
    }
    else {
      if (p->db->mallocFailed == '\0') {
        pOVar21 = p->aOp + local_70;
      }
      else {
        pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar21->p2 = p3 + iVar26;
      translateColumnToCopy
                (pParse,iVar25,pLevel->iTabCur,pSVar8->a[bVar3].regResult,pLevel->iIdxCur);
      sqlite3VdbeAddOp3(p,9,0,iVar25,0);
      puVar2 = &pSVar8->a[bVar3].fg.field_0x1;
      *puVar2 = *puVar2 & 0xdf;
    }
    uVar4 = p->db->mallocFailed;
    if (uVar4 == '\0') {
      pOVar21 = p->aOp + iVar25;
    }
    else {
      pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar21->p2 = p->nOp;
    if (iVar14 != 0) {
      bVar3 = pParse->nTempReg;
      if ((ulong)bVar3 < 8) {
        pParse->nTempReg = bVar3 + 1;
        pParse->aTempReg[bVar3] = iVar14;
      }
    }
    if (uVar4 == '\0') {
      pOVar21 = p->aOp + iVar12;
    }
    else {
      pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar21->p2 = p->nOp;
  }
LAB_0019e2d0:
  if (local_a0 == (Expr *)0x0) {
    return;
  }
  sqlite3ExprDeleteNN(pParse->db,local_a0);
  return;
}

Assistant:

static SQLITE_NOINLINE void constructAutomaticIndex(
  Parse *pParse,              /* The parsing context */
  const WhereClause *pWC,     /* The WHERE clause */
  const SrcItem *pSrc,        /* The FROM clause term to get the next index */
  const Bitmask notReady,     /* Mask of cursors that are not available */
  WhereLevel *pLevel          /* Write new index here */
){
  int nKeyCol;                /* Number of columns in the constructed index */
  WhereTerm *pTerm;           /* A single term of the WHERE clause */
  WhereTerm *pWCEnd;          /* End of pWC->a[] */
  Index *pIdx;                /* Object describing the transient index */
  Vdbe *v;                    /* Prepared statement under construction */
  int addrInit;               /* Address of the initialization bypass jump */
  Table *pTable;              /* The table being indexed */
  int addrTop;                /* Top of the index fill loop */
  int regRecord;              /* Register holding an index record */
  int n;                      /* Column counter */
  int i;                      /* Loop counter */
  int mxBitCol;               /* Maximum column in pSrc->colUsed */
  CollSeq *pColl;             /* Collating sequence to on a column */
  WhereLoop *pLoop;           /* The Loop object */
  char *zNotUsed;             /* Extra space on the end of pIdx */
  Bitmask idxCols;            /* Bitmap of columns used for indexing */
  Bitmask extraCols;          /* Bitmap of additional columns */
  u8 sentWarning = 0;         /* True if a warnning has been issued */
  Expr *pPartial = 0;         /* Partial Index Expression */
  int iContinue = 0;          /* Jump here to skip excluded rows */
  SrcItem *pTabItem;          /* FROM clause term being indexed */
  int addrCounter = 0;        /* Address where integer counter is initialized */
  int regBase;                /* Array of registers where record is assembled */

  /* Generate code to skip over the creation and initialization of the
  ** transient index on 2nd and subsequent iterations of the loop. */
  v = pParse->pVdbe;
  assert( v!=0 );
  addrInit = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);

  /* Count the number of columns that will be added to the index
  ** and used to match WHERE clause constraints */
  nKeyCol = 0;
  pTable = pSrc->pTab;
  pWCEnd = &pWC->a[pWC->nTerm];
  pLoop = pLevel->pWLoop;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    Expr *pExpr = pTerm->pExpr;
    /* Make the automatic index a partial index if there are terms in the
    ** WHERE clause (or the ON clause of a LEFT join) that constrain which
    ** rows of the target table (pSrc) that can be used. */
    if( (pTerm->wtFlags & TERM_VIRTUAL)==0
     && sqlite3ExprIsTableConstraint(pExpr, pSrc)
    ){
      pPartial = sqlite3ExprAnd(pParse, pPartial,
                                sqlite3ExprDup(pParse->db, pExpr, 0));
    }
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol;
      Bitmask cMask;
      assert( (pTerm->eOperator & (WO_OR|WO_AND))==0 );
      iCol = pTerm->u.x.leftColumn;
      cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS );
      testcase( iCol==BMS-1 );
      if( !sentWarning ){
        sqlite3_log(SQLITE_WARNING_AUTOINDEX,
            "automatic index on %s(%s)", pTable->zName,
            pTable->aCol[iCol].zCnName);
        sentWarning = 1;
      }
      if( (idxCols & cMask)==0 ){
        if( whereLoopResize(pParse->db, pLoop, nKeyCol+1) ){
          goto end_auto_index_create;
        }
        pLoop->aLTerm[nKeyCol++] = pTerm;
        idxCols |= cMask;
      }
    }
  }
  assert( nKeyCol>0 || pParse->db->mallocFailed );
  pLoop->u.btree.nEq = pLoop->nLTerm = nKeyCol;
  pLoop->wsFlags = WHERE_COLUMN_EQ | WHERE_IDX_ONLY | WHERE_INDEXED
                     | WHERE_AUTO_INDEX;

  /* Count the number of additional columns needed to create a
  ** covering index.  A "covering index" is an index that contains all
  ** columns that are needed by the query.  With a covering index, the
  ** original table never needs to be accessed.  Automatic indices must
  ** be a covering index because the index will not be updated if the
  ** original table changes and the index and table cannot both be used
  ** if they go out of sync.
  */
  extraCols = pSrc->colUsed & (~idxCols | MASKBIT(BMS-1));
  mxBitCol = MIN(BMS-1,pTable->nCol);
  testcase( pTable->nCol==BMS-1 );
  testcase( pTable->nCol==BMS-2 );
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ) nKeyCol++;
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    nKeyCol += pTable->nCol - BMS + 1;
  }

  /* Construct the Index object to describe this index */
  pIdx = sqlite3AllocateIndexObject(pParse->db, nKeyCol+1, 0, &zNotUsed);
  if( pIdx==0 ) goto end_auto_index_create;
  pLoop->u.btree.pIndex = pIdx;
  pIdx->zName = "auto-index";
  pIdx->pTable = pTable;
  n = 0;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol;
      Bitmask cMask;
      assert( (pTerm->eOperator & (WO_OR|WO_AND))==0 );
      iCol = pTerm->u.x.leftColumn;
      cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS-1 );
      testcase( iCol==BMS );
      if( (idxCols & cMask)==0 ){
        Expr *pX = pTerm->pExpr;
        idxCols |= cMask;
        pIdx->aiColumn[n] = pTerm->u.x.leftColumn;
        pColl = sqlite3ExprCompareCollSeq(pParse, pX);
        assert( pColl!=0 || pParse->nErr>0 ); /* TH3 collate01.800 */
        pIdx->azColl[n] = pColl ? pColl->zName : sqlite3StrBINARY;
        n++;
      }
    }
  }
  assert( (u32)n==pLoop->u.btree.nEq );

  /* Add additional columns needed to make the automatic index into
  ** a covering index */
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    for(i=BMS-1; i<pTable->nCol; i++){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  assert( n==nKeyCol );
  pIdx->aiColumn[n] = XN_ROWID;
  pIdx->azColl[n] = sqlite3StrBINARY;

  /* Create the automatic index */
  assert( pLevel->iIdxCur>=0 );
  pLevel->iIdxCur = pParse->nTab++;
  sqlite3VdbeAddOp2(v, OP_OpenAutoindex, pLevel->iIdxCur, nKeyCol+1);
  sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
  VdbeComment((v, "for %s", pTable->zName));
  if( OptimizationEnabled(pParse->db, SQLITE_BloomFilter) ){
    pLevel->regFilter = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Blob, 10000, pLevel->regFilter);
  }

  /* Fill the automatic index with content */
  pTabItem = &pWC->pWInfo->pTabList->a[pLevel->iFrom];
  if( pTabItem->fg.viaCoroutine ){
    int regYield = pTabItem->regReturn;
    addrCounter = sqlite3VdbeAddOp2(v, OP_Integer, 0, 0);
    sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, pTabItem->addrFillSub);
    addrTop =  sqlite3VdbeAddOp1(v, OP_Yield, regYield);
    VdbeCoverage(v);
    VdbeComment((v, "next row of %s", pTabItem->pTab->zName));
  }else{
    addrTop = sqlite3VdbeAddOp1(v, OP_Rewind, pLevel->iTabCur); VdbeCoverage(v);
  }
  if( pPartial ){
    iContinue = sqlite3VdbeMakeLabel(pParse);
    sqlite3ExprIfFalse(pParse, pPartial, iContinue, SQLITE_JUMPIFNULL);
    pLoop->wsFlags |= WHERE_PARTIALIDX;
  }
  regRecord = sqlite3GetTempReg(pParse);
  regBase = sqlite3GenerateIndexKey(
      pParse, pIdx, pLevel->iTabCur, regRecord, 0, 0, 0, 0
  );
  if( pLevel->regFilter ){
    sqlite3VdbeAddOp4Int(v, OP_FilterAdd, pLevel->regFilter, 0,
                         regBase, pLoop->u.btree.nEq);
  }
  sqlite3VdbeAddOp2(v, OP_IdxInsert, pLevel->iIdxCur, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  if( pPartial ) sqlite3VdbeResolveLabel(v, iContinue);
  if( pTabItem->fg.viaCoroutine ){
    sqlite3VdbeChangeP2(v, addrCounter, regBase+n);
    testcase( pParse->db->mallocFailed );
    assert( pLevel->iIdxCur>0 );
    translateColumnToCopy(pParse, addrTop, pLevel->iTabCur,
                          pTabItem->regResult, pLevel->iIdxCur);
    sqlite3VdbeGoto(v, addrTop);
    pTabItem->fg.viaCoroutine = 0;
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, pLevel->iTabCur, addrTop+1); VdbeCoverage(v);
    sqlite3VdbeChangeP5(v, SQLITE_STMTSTATUS_AUTOINDEX);
  }
  sqlite3VdbeJumpHere(v, addrTop);
  sqlite3ReleaseTempReg(pParse, regRecord);

  /* Jump here when skipping the initialization */
  sqlite3VdbeJumpHere(v, addrInit);

end_auto_index_create:
  sqlite3ExprDelete(pParse->db, pPartial);
}